

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O2

int slow_bitmap_andnot(unsigned_long *dst,unsigned_long *bitmap1,unsigned_long *bitmap2,long bits)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  for (uVar3 = 0; bits + 0x3fU >> 6 != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = bitmap2[uVar3];
    uVar2 = bitmap1[uVar3];
    dst[uVar3] = ~uVar1 & uVar2;
    uVar4 = uVar4 | ~uVar1 & uVar2;
  }
  return (int)(uVar4 != 0);
}

Assistant:

int slow_bitmap_andnot(unsigned long *dst, const unsigned long *bitmap1,
                       const unsigned long *bitmap2, long bits)
{
    long k;
    long nr = BITS_TO_LONGS(bits);
    unsigned long result = 0;

    for (k = 0; k < nr; k++) {
        result |= (dst[k] = bitmap1[k] & ~bitmap2[k]);
    }
    return result != 0;
}